

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int ERKStepSStolerances(void *arkode_mem,realtype reltol,realtype abstol)

{
  realtype in_RDI;
  ARKodeMem in_XMM0_Qa;
  realtype in_XMM1_Qa;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0.0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ERKStep","ERKStepSStolerances",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_4 = arkSStolerances(in_XMM0_Qa,in_XMM1_Qa,in_RDI);
  }
  return local_4;
}

Assistant:

int ERKStepSStolerances(void *arkode_mem, realtype reltol, realtype abstol)
{
  /* unpack ark_mem, call arkSStolerances, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepSStolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkSStolerances(ark_mem, reltol, abstol));
}